

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.cc
# Opt level: O2

MessageLite * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::AddWeak
          (RepeatedPtrFieldBase *this,MessageLite *prototype)

{
  int iVar1;
  ArenaImpl *this_00;
  int iVar2;
  Rep *pRVar3;
  undefined4 extraout_var;
  MessageLite *pMVar4;
  
  pRVar3 = this->rep_;
  if (pRVar3 == (Rep *)0x0) {
    iVar2 = this->total_size_;
  }
  else {
    iVar1 = this->current_size_;
    iVar2 = pRVar3->allocated_size;
    if (iVar1 < iVar2) {
      this->current_size_ = iVar1 + 1;
      return (MessageLite *)pRVar3->elements[iVar1];
    }
    if (iVar2 != this->total_size_) goto LAB_002118d6;
  }
  Reserve(this,iVar2 + 1);
  pRVar3 = this->rep_;
  iVar2 = pRVar3->allocated_size;
LAB_002118d6:
  pRVar3->allocated_size = iVar2 + 1;
  this_00 = (ArenaImpl *)this->arena_;
  if (prototype == (MessageLite *)0x0) {
    if (this_00 == (ArenaImpl *)0x0) {
      pMVar4 = (MessageLite *)operator_new(0x30);
      (pMVar4->_internal_metadata_).ptr_ = (void *)0x0;
    }
    else {
      ArenaImpl::RecordAlloc(this_00,(type_info *)&ImplicitWeakMessage::typeinfo,0x30);
      pMVar4 = (MessageLite *)
               ArenaImpl::AllocateAlignedAndAddCleanup
                         (this_00,0x30,
                          arena_destruct_object<google::protobuf::internal::ImplicitWeakMessage>);
      (pMVar4->_internal_metadata_).ptr_ = this_00;
    }
    pMVar4->_vptr_MessageLite = (_func_int **)&PTR__ImplicitWeakMessage_003b7cf0;
    pMVar4[1]._vptr_MessageLite = (_func_int **)(pMVar4 + 2);
    pMVar4[1]._internal_metadata_.ptr_ = (void *)0x0;
    *(undefined1 *)&pMVar4[2]._vptr_MessageLite = 0;
  }
  else {
    iVar2 = (*prototype->_vptr_MessageLite[4])(prototype,this_00);
    pMVar4 = (MessageLite *)CONCAT44(extraout_var,iVar2);
  }
  iVar2 = this->current_size_;
  this->current_size_ = iVar2 + 1;
  this->rep_->elements[iVar2] = pMVar4;
  return pMVar4;
}

Assistant:

MessageLite* RepeatedPtrFieldBase::AddWeak(const MessageLite* prototype) {
  if (rep_ != NULL && current_size_ < rep_->allocated_size) {
    return reinterpret_cast<MessageLite*>(rep_->elements[current_size_++]);
  }
  if (!rep_ || rep_->allocated_size == total_size_) {
    Reserve(total_size_ + 1);
  }
  ++rep_->allocated_size;
  MessageLite* result = prototype
                            ? prototype->New(arena_)
                            : Arena::CreateMessage<ImplicitWeakMessage>(arena_);
  rep_->elements[current_size_++] = result;
  return result;
}